

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManDupHashMapping(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int **local_38;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x9f7,"Gia_Man_t *Gia_ManDupHashMapping(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      iVar4 = pVVar8->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00215661;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar17 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_002156be:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_002156be;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar8 = p->vCis;
    } while (lVar15 < pVVar8->nSize);
  }
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar18 = 8;
    lVar15 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar17 = *(ulong *)((long)pGVar2 + lVar18 + -8);
      if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
        uVar10 = *(uint *)((long)pGVar2 +
                          lVar18 + (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar14 = *(uint *)((long)pGVar2 +
                              lVar18 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_002156dd;
        iVar4 = Gia_ManHashAnd(p_00,uVar10 ^ (uint)(uVar17 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar17 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar18) = iVar4;
        iVar4 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar15 < iVar4);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      iVar4 = pVVar8->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00215661:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      uVar14 = (uint)*(undefined8 *)pGVar2;
      uVar10 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) {
LAB_002156dd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar10);
      lVar15 = lVar15 + 1;
      pVVar8 = p->vCos;
    } while (lVar15 < pVVar8->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar4 = p->vMapping->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar13 = iVar4;
  }
  pVVar8->nCap = iVar13;
  if (iVar13 == 0) {
    pVVar8->pArray = (int *)0x0;
    iVar4 = p->nObjs;
    uVar17 = (ulong)iVar4;
    if (0 < (long)uVar17) {
      sVar5 = uVar17 << 2;
LAB_002154c6:
      piVar9 = (int *)malloc(sVar5);
      goto LAB_002154ce;
    }
  }
  else {
    piVar9 = (int *)malloc((long)iVar13 << 2);
    pVVar8->pArray = piVar9;
    uVar10 = p->nObjs;
    uVar17 = (ulong)uVar10;
    if (iVar13 < (int)uVar10) {
      sVar5 = (long)(int)uVar10 << 2;
      if (piVar9 == (int *)0x0) goto LAB_002154c6;
      piVar9 = (int *)realloc(piVar9,sVar5);
LAB_002154ce:
      local_38 = &pVVar8->pArray;
      *local_38 = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar8->nCap = (int)uVar17;
    }
    local_38 = &pVVar8->pArray;
    iVar4 = (int)uVar17;
    if (0 < iVar4) {
      memset(piVar9,0,(uVar17 & 0xffffffff) << 2);
      iVar13 = p->nObjs;
      pVVar8->nSize = iVar4;
      if (1 < iVar13) {
        lVar15 = 1;
        do {
          pVVar11 = p->vMapping;
          if (pVVar11->nSize <= lVar15) goto LAB_00215680;
          piVar9 = pVVar11->pArray;
          if (piVar9[lVar15] != 0) {
            pGVar2 = p->pObjs;
            uVar10 = pGVar2[lVar15].Value;
            if ((int)uVar10 < 0) {
LAB_0021569f:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar10 = uVar10 >> 1;
            if (pVVar8->nSize <= (int)uVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (*local_38)[uVar10] = pVVar8->nSize;
            if (pVVar11->nSize <= lVar15) {
LAB_00215680:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar10 = piVar9[lVar15];
            if (((long)(int)uVar10 < 0) || ((uint)pVVar11->nSize <= uVar10)) goto LAB_00215680;
            Vec_IntPush(pVVar8,piVar9[(int)uVar10]);
            pVVar11 = p->vMapping;
            lVar18 = (long)pVVar11->nSize;
            if (lVar18 <= lVar15) goto LAB_00215680;
            lVar16 = 0;
            while( true ) {
              piVar9 = pVVar11->pArray;
              lVar12 = (long)piVar9[lVar15];
              if ((lVar12 < 0) || ((uint)lVar18 <= (uint)piVar9[lVar15])) goto LAB_00215680;
              if (piVar9[lVar12] <= lVar16) break;
              iVar4 = piVar9[lVar12 + lVar16 + 1];
              if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00215661;
              uVar10 = p->pObjs[iVar4].Value;
              if ((int)uVar10 < 0) goto LAB_0021569f;
              Vec_IntPush(pVVar8,uVar10 >> 1);
              lVar16 = lVar16 + 1;
              pVVar11 = p->vMapping;
              lVar18 = (long)pVVar11->nSize;
              if (lVar18 <= lVar15) goto LAB_00215680;
            }
            uVar10 = pGVar2[lVar15].Value;
            if ((int)uVar10 < 0) goto LAB_0021569f;
            Vec_IntPush(pVVar8,uVar10 >> 1);
            iVar13 = p->nObjs;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar13);
      }
      goto LAB_00215648;
    }
  }
  pVVar8->nSize = iVar4;
LAB_00215648:
  p_00->vMapping = pVVar8;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHashMapping( Gia_Man_t * p )
{
    Gia_Man_t * pNew; 
    Vec_Int_t * vMapping; 
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Gia_ManHasMapping(p) );
    // copy the old manager with hashing
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // recreate mapping
    vMapping = Vec_IntAlloc( Vec_IntSize(p->vMapping) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( p, i )
    {
        pObj = Gia_ManObj( p, i );
        Vec_IntWriteEntry( vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFaninObj( p, i, pFanin, k )
            Vec_IntPush( vMapping, Abc_Lit2Var(pFanin->Value)  );
        Vec_IntPush( vMapping, Abc_Lit2Var(pObj->Value) );
    }
    pNew->vMapping = vMapping;
    return pNew;
}